

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

void xmlRelaxNGValidErrorPop(xmlRelaxNGValidCtxtPtr ctxt)

{
  int iVar1;
  xmlRelaxNGValidErrorPtr pxVar2;
  uint uVar3;
  xmlRelaxNGValidErrorPtr pxVar4;
  
  iVar1 = ctxt->errNr;
  if (0 < (long)iVar1) {
    uVar3 = iVar1 - 1;
    ctxt->errNr = uVar3;
    pxVar2 = ctxt->errTab;
    pxVar4 = (xmlRelaxNGValidErrorPtr)0x0;
    if (iVar1 != 1) {
      pxVar4 = pxVar2 + (long)iVar1 + -2;
    }
    ctxt->err = pxVar4;
    if ((pxVar2[uVar3].flags & 1) != 0) {
      if (pxVar2[uVar3].arg1 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar2[uVar3].arg1);
      }
      pxVar2[uVar3].arg1 = (xmlChar *)0x0;
      if (pxVar2[uVar3].arg2 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar2[uVar3].arg2);
      }
      pxVar2[uVar3].arg2 = (xmlChar *)0x0;
      pxVar2[uVar3].flags = 0;
    }
    return;
  }
  ctxt->err = (xmlRelaxNGValidErrorPtr)0x0;
  return;
}

Assistant:

static void
xmlRelaxNGValidErrorPop(xmlRelaxNGValidCtxtPtr ctxt)
{
    xmlRelaxNGValidErrorPtr cur;

    if (ctxt->errNr <= 0) {
        ctxt->err = NULL;
        return;
    }
    ctxt->errNr--;
    if (ctxt->errNr > 0)
        ctxt->err = &ctxt->errTab[ctxt->errNr - 1];
    else
        ctxt->err = NULL;
    cur = &ctxt->errTab[ctxt->errNr];
    if (cur->flags & ERROR_IS_DUP) {
        if (cur->arg1 != NULL)
            xmlFree((xmlChar *) cur->arg1);
        cur->arg1 = NULL;
        if (cur->arg2 != NULL)
            xmlFree((xmlChar *) cur->arg2);
        cur->arg2 = NULL;
        cur->flags = 0;
    }
}